

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O3

tmsize_t TIFFWriteRawTile(TIFF *tif,uint32_t tile,void *data,tmsize_t cc)

{
  int iVar1;
  
  if (((tif->tif_flags & 0x40) != 0) ||
     (iVar1 = TIFFWriteCheck(tif,1,"TIFFWriteRawTile"), iVar1 != 0)) {
    if (tile < (tif->tif_dir).td_nstrips) {
      iVar1 = TIFFAppendToStrip(tif,tile,(uint8_t *)data,cc);
      return -(ulong)(iVar1 == 0) | cc;
    }
    TIFFErrorExtR(tif,"TIFFWriteRawTile","Tile %lu out of range, max %lu",tile);
  }
  return -1;
}

Assistant:

tmsize_t TIFFWriteRawTile(TIFF *tif, uint32_t tile, void *data, tmsize_t cc)
{
    static const char module[] = "TIFFWriteRawTile";

    if (!WRITECHECKTILES(tif, module))
        return ((tmsize_t)(-1));
    if (tile >= tif->tif_dir.td_nstrips)
    {
        TIFFErrorExtR(tif, module, "Tile %lu out of range, max %lu",
                      (unsigned long)tile,
                      (unsigned long)tif->tif_dir.td_nstrips);
        return ((tmsize_t)(-1));
    }
    return (TIFFAppendToStrip(tif, tile, (uint8_t *)data, cc) ? cc
                                                              : (tmsize_t)(-1));
}